

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void test_kx_nk(void)

{
  _Bool _Var1;
  hydro_kx_session_keypair kp_server;
  hydro_kx_session_keypair kp_client;
  uint8_t packet2 [48];
  uint8_t packet1 [48];
  uint8_t psk [32];
  hydro_kx_keypair server_static_kp;
  hydro_kx_state st_client;
  undefined1 auStack_1b8 [8];
  uint8_t *in_stack_fffffffffffffe50;
  uint8_t *in_stack_fffffffffffffe58;
  hydro_kx_session_keypair *in_stack_fffffffffffffe60;
  hydro_kx_state *in_stack_fffffffffffffe68;
  undefined1 local_178 [32];
  undefined1 auStack_158 [48];
  hydro_kx_keypair *in_stack_fffffffffffffed8;
  uint8_t *in_stack_fffffffffffffee0;
  uint8_t *in_stack_fffffffffffffee8;
  uint8_t *in_stack_fffffffffffffef0;
  hydro_kx_session_keypair *in_stack_fffffffffffffef8;
  
  hydro_kx_keygen((hydro_kx_keypair *)0x103414);
  hydro_kx_nk_1(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60->rx,in_stack_fffffffffffffe58,
                in_stack_fffffffffffffe50);
  hydro_kx_nk_2(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  hydro_kx_nk_3(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  _Var1 = hydro_equal(auStack_158,auStack_1b8,0x20);
  if (!_Var1) {
    __assert_fail("hydro_equal(kp_client.tx, kp_server.rx, hydro_kx_SESSIONKEYBYTES)",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0x192,"void test_kx_nk(void)");
  }
  _Var1 = hydro_equal(local_178,&stack0xfffffffffffffe68,0x20);
  if (!_Var1) {
    __assert_fail("hydro_equal(kp_client.rx, kp_server.tx, hydro_kx_SESSIONKEYBYTES)",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0x193,"void test_kx_nk(void)");
  }
  hydro_random_buf(in_stack_fffffffffffffe60,(size_t)in_stack_fffffffffffffe58);
  hydro_kx_nk_1(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60->rx,in_stack_fffffffffffffe58,
                in_stack_fffffffffffffe50);
  hydro_kx_nk_2(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  hydro_kx_nk_3(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  _Var1 = hydro_equal(auStack_158,auStack_1b8,0x20);
  if (!_Var1) {
    __assert_fail("hydro_equal(kp_client.tx, kp_server.rx, hydro_kx_SESSIONKEYBYTES)",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0x19b,"void test_kx_nk(void)");
  }
  _Var1 = hydro_equal(local_178,&stack0xfffffffffffffe68,0x20);
  if (!_Var1) {
    __assert_fail("hydro_equal(kp_client.rx, kp_server.tx, hydro_kx_SESSIONKEYBYTES)",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0x19c,"void test_kx_nk(void)");
  }
  return;
}

Assistant:

static void
test_kx_nk(void)
{
    hydro_kx_state           st_client;
    hydro_kx_keypair         server_static_kp;
    uint8_t                  psk[hydro_kx_PSKBYTES];
    uint8_t                  packet1[hydro_kx_NK_PACKET1BYTES];
    uint8_t                  packet2[hydro_kx_NK_PACKET2BYTES];
    hydro_kx_session_keypair kp_client;
    hydro_kx_session_keypair kp_server;

    hydro_kx_keygen(&server_static_kp);

    hydro_kx_nk_1(&st_client, packet1, NULL, server_static_kp.pk);
    hydro_kx_nk_2(&kp_server, packet2, packet1, NULL, &server_static_kp);
    hydro_kx_nk_3(&st_client, &kp_client, packet2);

    assert(hydro_equal(kp_client.tx, kp_server.rx, hydro_kx_SESSIONKEYBYTES));
    assert(hydro_equal(kp_client.rx, kp_server.tx, hydro_kx_SESSIONKEYBYTES));

    hydro_random_buf(psk, sizeof psk);

    hydro_kx_nk_1(&st_client, packet1, psk, server_static_kp.pk);
    hydro_kx_nk_2(&kp_server, packet2, packet1, psk, &server_static_kp);
    hydro_kx_nk_3(&st_client, &kp_client, packet2);

    assert(hydro_equal(kp_client.tx, kp_server.rx, hydro_kx_SESSIONKEYBYTES));
    assert(hydro_equal(kp_client.rx, kp_server.tx, hydro_kx_SESSIONKEYBYTES));
}